

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyxml2.cpp
# Opt level: O0

XMLError __thiscall tinyxml2::XMLDocument::LoadFile(XMLDocument *this,char *filename)

{
  FILE *__stream;
  FILE *fp;
  char *filename_local;
  XMLDocument *this_local;
  
  if (filename == (char *)0x0) {
    SetError(this,XML_ERROR_FILE_COULD_NOT_BE_OPENED,0,"filename=<null>");
    this_local._4_4_ = this->_errorID;
  }
  else {
    Clear(this);
    __stream = (FILE *)callfopen(filename,"rb");
    if (__stream == (FILE *)0x0) {
      SetError(this,XML_ERROR_FILE_NOT_FOUND,0,"filename=%s",filename);
      this_local._4_4_ = this->_errorID;
    }
    else {
      LoadFile(this,(FILE *)__stream);
      fclose(__stream);
      this_local._4_4_ = this->_errorID;
    }
  }
  return this_local._4_4_;
}

Assistant:

XMLError XMLDocument::LoadFile(const char* filename)
{
    if (!filename) {
        TIXMLASSERT(false);
        SetError(XML_ERROR_FILE_COULD_NOT_BE_OPENED, 0, "filename=<null>");
        return _errorID;
    }

    Clear();
    FILE* fp = callfopen(filename, "rb");
    if (!fp) {
        SetError(XML_ERROR_FILE_NOT_FOUND, 0, "filename=%s", filename);
        return _errorID;
    }
    LoadFile(fp);
    fclose(fp);
    return _errorID;
}